

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::ParsedScene::Texture
          (ParsedScene *this,string *name,string *type,string *texname,ParsedParameterVector params,
          FileLoc loc)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  FileLoc loc_00;
  polymorphic_allocator<pbrt::ParsedParameter_*> pVar2;
  ParsedParameter **ppPVar3;
  undefined8 uVar4;
  bool bVar5;
  __type_conflict _Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>_>_>
  *__range1;
  vector<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>>>
  *this_00;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_R8;
  ParameterDictionary local_b28;
  ParameterDictionary local_ac0;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_a58;
  TextureSceneEntity local_9f8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>
  local_680;
  AnimatedTransform local_2e8;
  
  if (this->currentBlock == OptionsBlock) {
    ErrorExit<char_const(&)[8]>
              ((FileLoc *)&params,
               "Scene description must be inside world block; \"%s\" is not allowed.",
               (char (*) [8])0x2c6f6d7);
  }
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_a58,in_R8);
  ParameterDictionary::ParameterDictionary
            (&local_b28,&local_a58,&(this->graphicsState).textureAttributes,
             (this->graphicsState).colorSpace);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_a58);
  bVar5 = std::operator!=(type,"float");
  if (bVar5) {
    bVar5 = std::operator!=(type,"spectrum");
    if (bVar5) {
      (this->super_SceneRepresentation).errorExit = true;
      Error<std::__cxx11::string_const&>
                ((FileLoc *)&params,"%s: texture type unknown. Must be \"float\" or \"spectrum\".",
                 type);
      goto LAB_00378d62;
    }
  }
  bVar5 = std::operator==(type,"float");
  this_00 = (vector<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>>>
             *)&this->spectrumTextures;
  if (bVar5) {
    this_00 = (vector<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>>>
               *)&this->floatTextures;
  }
  __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this_00;
  pbVar1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this_00 + 8);
  do {
    if (__lhs == pbVar1) {
      ParameterDictionary::ParameterDictionary(&local_ac0,&local_b28);
      uVar4 = params.field_2.fixed[0];
      ppPVar3 = params.ptr;
      pVar2 = params.alloc;
      RenderFromObject(&local_2e8,this);
      loc_00.filename._M_str = (char *)ppPVar3;
      loc_00.filename._M_len = (size_t)pVar2.memoryResource;
      loc_00._16_8_ = uVar4;
      TextureSceneEntity::TextureSceneEntity(&local_9f8,texname,&local_ac0,loc_00,&local_2e8);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>
      ::pair<pbrt::TextureSceneEntity,_true>(&local_680,name,&local_9f8);
      std::
      vector<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>>>
      ::emplace_back<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>>(this_00,&local_680);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TextureSceneEntity>
      ::~pair(&local_680);
      TextureSceneEntity::~TextureSceneEntity(&local_9f8);
      InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
      ::~InlinedVector(&local_ac0.params);
      goto LAB_00378d62;
    }
    _Var6 = std::operator==(__lhs,name);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&__lhs[0x1c].field_2 + 8);
  } while (!_Var6);
  (this->super_SceneRepresentation).errorExit = true;
  Error<std::__cxx11::string_const&>((FileLoc *)&params,"Redefining texture \"%s\".",name);
LAB_00378d62:
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_b28.params);
  return;
}

Assistant:

void ParsedScene::Texture(const std::string &name, const std::string &type,
                          const std::string &texname, ParsedParameterVector params,
                          FileLoc loc) {
    VERIFY_WORLD("Texture");

    ParameterDictionary dict(std::move(params), graphicsState.textureAttributes,
                             graphicsState.colorSpace);

    if (type != "float" && type != "spectrum") {
        ErrorExitDeferred(
            &loc, "%s: texture type unknown. Must be \"float\" or \"spectrum\".", type);
        return;
    }

    std::vector<std::pair<std::string, TextureSceneEntity>> &textures =
        (type == "float") ? floatTextures : spectrumTextures;

    for (const auto &tex : textures)
        if (tex.first == name) {
            ErrorExitDeferred(&loc, "Redefining texture \"%s\".", name);
            return;
        }

    textures.push_back(std::make_pair(
        name, TextureSceneEntity(texname, std::move(dict), loc, RenderFromObject())));
}